

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  FILE *__stream;
  stringstream local_1c0 [8];
  stringstream stream;
  ostream local_1b0 [376];
  string local_38;
  
  __stream = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_1c0);
  PrintXmlUnitTest(local_1b0,unit_test);
  StringStreamToString(&local_38,(stringstream *)local_1c0);
  fputs(local_38._M_dataplus._M_p,__stream);
  std::__cxx11::string::~string((string *)&local_38);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}